

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

PointerType __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  SnapshotDataType *pSVar4;
  iterator *this_local;
  
  if (this->Tree == (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x4c,
                  "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar3 = std::
          vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
          ::size(&this->Tree->Data);
  if (sVar2 != sVar3) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x4d,
                  "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  uVar1 = this->Position;
  sVar2 = std::
          vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
          ::size(&this->Tree->Data);
  if (sVar2 < uVar1) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x4e,
                  "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  if (this->Position != 0) {
    pSVar4 = GetPointer(this->Tree,this->Position - 1);
    return pSVar4;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0x4f,
                "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

PointerType operator->()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }